

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O0

bool qWidgetShortcutContextMatcher(QObject *object,ShortcutContext context)

{
  bool bVar1;
  byte bVar2;
  QWidget *a_00;
  QWidget *pQVar3;
  ulong uVar4;
  QAction *pQVar5;
  QGraphicsWidget *pQVar6;
  QShortcut *pQVar7;
  QWidgetWindow *pQVar8;
  ShortcutContext in_ESI;
  QWidget *in_RDI;
  ShortcutContext unaff_retaddr;
  QWidgetWindow *widget_window;
  QWindow *qwindow_1;
  QShortcut *s;
  QWidget *w;
  QGraphicsWidget *gw;
  QAction *a;
  QWidgetWindow *widgetWindow;
  QWindow *qwindow;
  QWidget *active_window;
  QObject *in_stack_ffffffffffffff98;
  QWindow *local_58;
  QWidget *local_48;
  QWidget *in_stack_ffffffffffffffd8;
  ShortcutContext in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  a_00 = QApplication::activeWindow();
  pQVar3 = QApplication::activePopupWidget();
  if (pQVar3 != (QWidget *)0x0) {
    a_00 = QApplication::activePopupWidget();
  }
  if (((a_00 == (QWidget *)0x0) &&
      (in_stack_ffffffffffffffd8 = (QWidget *)QGuiApplication::focusWindow(),
      in_stack_ffffffffffffffd8 != (QWidget *)0x0)) &&
     (uVar4 = QWindow::isActive(), (uVar4 & 1) != 0)) {
    for (; in_stack_ffffffffffffffd8 != (QWidget *)0x0;
        in_stack_ffffffffffffffd8 = (QWidget *)QWindow::parent(in_stack_ffffffffffffffd8,0)) {
      pQVar8 = qobject_cast<QWidgetWindow*>((QObject *)0x4beb0e);
      if (pQVar8 != (QWidgetWindow *)0x0) {
        a_00 = QWidgetWindow::widget((QWidgetWindow *)0x4beb25);
        break;
      }
    }
  }
  pQVar5 = qobject_cast<QAction*>((QObject *)0x4beb4d);
  if (pQVar5 == (QAction *)0x0) {
    pQVar6 = qobject_cast<QGraphicsWidget*>((QObject *)0x4beb82);
    if (pQVar6 == (QGraphicsWidget *)0x0) {
      local_48 = qobject_cast<QWidget*>(in_stack_ffffffffffffff98);
      if ((local_48 == (QWidget *)0x0) &&
         (pQVar7 = qobject_cast<QShortcut*>((QObject *)0x4bebce), pQVar7 != (QShortcut *)0x0)) {
        QObject::parent((QObject *)0x4bebe5);
        local_48 = qobject_cast<QWidget*>(in_stack_ffffffffffffff98);
      }
      if (local_48 == (QWidget *)0x0) {
        for (local_58 = qobject_cast<QWindow*>(in_stack_ffffffffffffff98);
            local_58 != (QWindow *)0x0; local_58 = (QWindow *)QWindow::parent(local_58,0)) {
          pQVar8 = qobject_cast<QWidgetWindow*>((QObject *)0x4bec1d);
          if (pQVar8 != (QWidgetWindow *)0x0) {
            local_48 = QWidgetWindow::widget((QWidgetWindow *)0x4bec34);
            break;
          }
        }
      }
      if (local_48 == (QWidget *)0x0) {
        bVar2 = QShortcutPrivate::simpleContextMatcher(&in_RDI->super_QObject,in_ESI);
        bVar1 = (bool)(bVar2 & 1);
      }
      else {
        bVar1 = correctWidgetContext
                          (unaff_retaddr,
                           (QWidget *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                           in_RDI);
      }
    }
    else {
      bVar1 = correctGraphicsWidgetContext
                        ((ShortcutContext)active_window,(QGraphicsWidget *)qwindow,
                         (QWidget *)widgetWindow);
    }
  }
  else {
    bVar1 = correctActionContext
                      (in_stack_ffffffffffffffe8,(QAction *)a_00,in_stack_ffffffffffffffd8);
  }
  return bVar1;
}

Assistant:

bool qWidgetShortcutContextMatcher(QObject *object, Qt::ShortcutContext context)
{
    Q_ASSERT_X(object, "QShortcutMap", "Shortcut has no owner. Illegal map state!");

    QWidget *active_window = QApplication::activeWindow();

    // popups do not become the active window,
    // so we fake it here to get the correct context
    // for the shortcut system.
    if (QApplication::activePopupWidget())
        active_window = QApplication::activePopupWidget();

    if (!active_window) {
        QWindow *qwindow = QGuiApplication::focusWindow();
        if (qwindow && qwindow->isActive()) {
            while (qwindow) {
                if (auto widgetWindow = qobject_cast<QWidgetWindow *>(qwindow)) {
                    active_window = widgetWindow->widget();
                    break;
                }
                qwindow = qwindow->parent();
            }
        }
    }

#if QT_CONFIG(action)
    if (auto a = qobject_cast<QAction *>(object))
        return correctActionContext(context, a, active_window);
#endif

#if QT_CONFIG(graphicsview)
    if (auto gw = qobject_cast<QGraphicsWidget *>(object))
        return correctGraphicsWidgetContext(context, gw, active_window);
#endif

    auto w = qobject_cast<QWidget *>(object);
    if (!w) {
        if (auto s = qobject_cast<QShortcut *>(object))
            w = qobject_cast<QWidget *>(s->parent());
    }

    if (!w) {
        auto qwindow = qobject_cast<QWindow *>(object);
        while (qwindow) {
            if (auto widget_window = qobject_cast<QWidgetWindow *>(qwindow)) {
                w = widget_window->widget();
                break;
            }
            qwindow = qwindow->parent();
        }
    }

    if (w)
        return correctWidgetContext(context, w, active_window);

    return QShortcutPrivate::simpleContextMatcher(object, context);
}